

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O1

void __thiscall
ManchesterAnalyzerSettings::LoadSettings(ManchesterAnalyzerSettings *this,char *settings)

{
  char cVar1;
  int iVar2;
  SimpleArchive text_archive;
  ManchesterTolerance tolerance;
  char *name_string;
  SimpleArchive local_30 [12];
  ManchesterTolerance local_24;
  char *local_20;
  
  SimpleArchive::SimpleArchive(local_30);
  SimpleArchive::SetString((char *)local_30);
  SimpleArchive::operator>>(local_30,&local_20);
  iVar2 = strcmp(local_20,"SaleaeManchesterAnalyzer");
  if (iVar2 != 0) {
    AnalyzerHelpers::Assert
              (
              "SaleaeManchesterAnalyzer: Provided with a settings string that doesn\'t belong to us;"
              );
  }
  SimpleArchive::operator>>(local_30,&this->mInputChannel);
  SimpleArchive::operator>>(local_30,&this->mMode);
  SimpleArchive::operator>>(local_30,&this->mBitRate);
  SimpleArchive::operator>>(local_30,&this->mInverted);
  SimpleArchive::operator>>(local_30,&this->mBitsPerTransfer);
  SimpleArchive::operator>>(local_30,&this->mShiftOrder);
  SimpleArchive::operator>>(local_30,&this->mBitsToIgnore);
  cVar1 = SimpleArchive::operator>>(local_30,&local_24);
  if (cVar1 != '\0') {
    this->mTolerance = local_24;
  }
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_30);
  return;
}

Assistant:

void ManchesterAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    const char* name_string; // the first thing in the archive is the name of the protocol analyzer that the data belongs to.
    text_archive >> &name_string;
    if( strcmp( name_string, "SaleaeManchesterAnalyzer" ) != 0 )
        AnalyzerHelpers::Assert( "SaleaeManchesterAnalyzer: Provided with a settings string that doesn't belong to us;" );

    text_archive >> mInputChannel;
    text_archive >> *( U32* )&mMode;
    text_archive >> mBitRate;
    text_archive >> mInverted;
    text_archive >> mBitsPerTransfer;
    text_archive >> *( U32* )&mShiftOrder;
    text_archive >> mBitsToIgnore;

    ManchesterTolerance tolerance;
    if( text_archive >> *( U32* )&tolerance )
        mTolerance = tolerance;

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", true );

    UpdateInterfacesFromSettings();
}